

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t *frame)

{
  caption_frame_buffer_t *pcVar1;
  uint uVar2;
  uint uVar3;
  libcaption_stauts_t lVar4;
  caption_frame_cell_t (*pacVar5) [32];
  caption_frame_cell_t (*__dest) [32];
  long lVar6;
  ulong uVar7;
  
  lVar4 = LIBCAPTION_ERROR;
  uVar2 = (uint)(byte)(frame->state).row;
  if (uVar2 < 0xf) {
    lVar4 = LIBCAPTION_OK;
    uVar3 = *(uint *)&frame->state >> 4 & 3;
    if ((uVar3 != 0) && (uVar2 = (uVar2 - uVar3) + 1, 0 < (int)uVar2)) {
      uVar7 = (ulong)uVar2;
      lVar6 = uVar7 << 8;
      for (; (int)uVar7 < 0xf; uVar7 = uVar7 + 1) {
        pcVar1 = frame->write;
        uVar2 = (int)uVar7 - 1;
        __dest = pcVar1->cell + uVar2;
        pacVar5 = (caption_frame_cell_t (*) [32])(pcVar1->cell[0][0].data + lVar6 + -1);
        if (pcVar1 == (caption_frame_buffer_t *)0x0) {
          pacVar5 = (caption_frame_cell_t (*) [32])0x0;
          __dest = (caption_frame_cell_t (*) [32])0x0;
        }
        if (0xe < uVar2) {
          __dest = (caption_frame_cell_t (*) [32])0x0;
        }
        if (0xe < uVar7) {
          pacVar5 = (caption_frame_cell_t (*) [32])0x0;
        }
        memcpy(__dest,pacVar5,0x100);
        lVar6 = lVar6 + 0x100;
      }
      (frame->state).col = '\0';
      pacVar5 = frame->write->cell + 0xe;
      if (frame->write == (caption_frame_buffer_t *)0x0) {
        pacVar5 = (caption_frame_cell_t (*) [32])0x0;
      }
      memset(pacVar5,0,0x100);
    }
  }
  return lVar4;
}

Assistant:

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t* frame)
{
    if (0 > frame->state.row || SCREEN_ROWS <= frame->state.row) {
        return LIBCAPTION_ERROR;
    }

    int r = frame->state.row - (frame->state.rup - 1);

    if (0 >= r || !caption_frame_rollup(frame)) {
        return LIBCAPTION_OK;
    }

    for (; r < SCREEN_ROWS; ++r) {
        uint8_t* dst = (uint8_t*)frame_buffer_cell(frame->write, r - 1, 0);
        uint8_t* src = (uint8_t*)frame_buffer_cell(frame->write, r - 0, 0);
        memcpy(dst, src, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    }

    frame->state.col = 0;
    caption_frame_cell_t* cell = frame_buffer_cell(frame->write, SCREEN_ROWS - 1, 0);
    memset(cell, 0, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    return LIBCAPTION_OK;
}